

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O1

bool vkt::pipeline::isVertexFormatSint(VkFormat format)

{
  if (((0x3d < format - VK_FORMAT_R8_SINT) ||
      ((0x2080100810204081U >> ((ulong)(format - VK_FORMAT_R8_SINT) & 0x3f) & 1) == 0)) &&
     ((0x1a < format - VK_FORMAT_R16G16_SINT ||
      ((0x4924081U >> (format - VK_FORMAT_R16G16_SINT & 0x1f) & 1) == 0)))) {
    return false;
  }
  return true;
}

Assistant:

bool isVertexFormatSint (VkFormat format)
{
	switch (format)
	{
		case VK_FORMAT_R8_SINT:
		case VK_FORMAT_R8G8_SINT:
		case VK_FORMAT_R16_SINT:
		case VK_FORMAT_R8G8B8_SINT:
		case VK_FORMAT_B8G8R8_SINT:
		case VK_FORMAT_R8G8B8A8_SINT:
		case VK_FORMAT_A2R10G10B10_UNORM_PACK32:
		case VK_FORMAT_R16G16_SINT:
		case VK_FORMAT_R32_SINT:
		case VK_FORMAT_B8G8R8A8_SINT:
		case VK_FORMAT_A2B10G10R10_SINT_PACK32:
		case VK_FORMAT_R16G16B16_SINT:
		case VK_FORMAT_R16G16B16A16_SINT:
		case VK_FORMAT_R32G32_SINT:
		case VK_FORMAT_R32G32B32_SINT:
		case VK_FORMAT_R32G32B32A32_SINT:
			return true;

		default:
			break;
	}

	return false;
}